

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

VkBufferImageCopy *
Diligent::GetBufferImageCopyInfo
          (VkBufferImageCopy *__return_storage_ptr__,Uint64 BufferOffset,
          Uint32 BufferRowStrideInTexels,TextureDesc *TexDesc,Box *Region,Uint32 MipLevel,
          Uint32 ArraySlice)

{
  bool bVar1;
  Uint32 UVar2;
  Uint32 UVar3;
  Uint32 UVar4;
  Char *pCVar5;
  undefined1 local_b8 [8];
  string msg_2;
  undefined1 local_88 [8];
  string msg_1;
  TextureFormatAttribs *FmtAttribs;
  undefined1 local_50 [8];
  string msg;
  Uint32 MipLevel_local;
  Box *Region_local;
  TextureDesc *TexDesc_local;
  Uint32 BufferRowStrideInTexels_local;
  Uint64 BufferOffset_local;
  
  msg.field_2._12_4_ = MipLevel;
  memset(__return_storage_ptr__,0,0x38);
  if ((BufferOffset & 3) != 0) {
    FormatString<char[50]>
              ((string *)local_50,(char (*) [50])"Source buffer offset must be multiple of 4 (18.4)"
              );
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"GetBufferImageCopyInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xa09);
    std::__cxx11::string::~string((string *)local_50);
  }
  __return_storage_ptr__->bufferOffset = BufferOffset;
  __return_storage_ptr__->bufferRowLength = BufferRowStrideInTexels;
  __return_storage_ptr__->bufferImageHeight = 0;
  msg_1.field_2._8_8_ = GetTextureFormatAttribs(TexDesc->Format);
  if (((TextureFormatAttribs *)msg_1.field_2._8_8_)->ComponentType == COMPONENT_TYPE_DEPTH) {
    (__return_storage_ptr__->imageSubresource).aspectMask = 2;
  }
  else if (((TextureFormatAttribs *)msg_1.field_2._8_8_)->ComponentType ==
           COMPONENT_TYPE_DEPTH_STENCIL) {
    FormatString<char[58]>
              ((string *)local_88,
               (char (*) [58])"Updating depth-stencil texture is not currently supported");
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"GetBufferImageCopyInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xa18);
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    (__return_storage_ptr__->imageSubresource).aspectMask = 1;
  }
  (__return_storage_ptr__->imageSubresource).baseArrayLayer = ArraySlice;
  (__return_storage_ptr__->imageSubresource).layerCount = 1;
  (__return_storage_ptr__->imageSubresource).mipLevel = msg.field_2._12_4_;
  msg_2.field_2._12_4_ = Region->MinX;
  UVar2 = Region->MinY;
  UVar3 = Region->MinZ;
  (__return_storage_ptr__->imageOffset).x = msg_2.field_2._12_4_;
  (__return_storage_ptr__->imageOffset).y = UVar2;
  (__return_storage_ptr__->imageOffset).z = UVar3;
  bVar1 = Box::IsValid(Region);
  if (!bVar1) {
    FormatString<char[2],unsigned_int,char[5],unsigned_int,char[6],unsigned_int,char[5],unsigned_int,char[6],unsigned_int,char[5],unsigned_int,char[24]>
              ((string *)local_b8,(Diligent *)0xccb105,(char (*) [2])Region,(uint *)0xc2819c,
               (char (*) [5])&Region->MaxX,(uint *)") x [",(char (*) [6])&Region->MinY,
               (uint *)0xc2819c,(char (*) [5])&Region->MaxY,(uint *)") x [",
               (char (*) [6])&Region->MinZ,(uint *)0xc2819c,(char (*) [5])&Region->MaxZ,
               (uint *)") is not a valid region",(char (*) [24])&stack0xfffffffffffffec8);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"GetBufferImageCopyInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xa31);
    std::__cxx11::string::~string((string *)local_b8);
  }
  UVar2 = Box::Width(Region);
  UVar3 = Box::Height(Region);
  UVar4 = Box::Depth(Region);
  (__return_storage_ptr__->imageExtent).width = UVar2;
  (__return_storage_ptr__->imageExtent).height = UVar3;
  (__return_storage_ptr__->imageExtent).depth = UVar4;
  return __return_storage_ptr__;
}

Assistant:

static VkBufferImageCopy GetBufferImageCopyInfo(Uint64             BufferOffset,
                                                Uint32             BufferRowStrideInTexels,
                                                const TextureDesc& TexDesc,
                                                const Box&         Region,
                                                Uint32             MipLevel,
                                                Uint32             ArraySlice)
{
    VkBufferImageCopy CopyRegion = {};
    VERIFY((BufferOffset % 4) == 0, "Source buffer offset must be multiple of 4 (18.4)");
    CopyRegion.bufferOffset = BufferOffset; // must be a multiple of 4 (18.4)

    // bufferRowLength and bufferImageHeight specify the data in buffer memory as a subregion of a larger two- or
    // three-dimensional image, and control the addressing calculations of data in buffer memory. If either of these
    // values is zero, that aspect of the buffer memory is considered to be tightly packed according to the imageExtent (18.4).
    CopyRegion.bufferRowLength   = BufferRowStrideInTexels;
    CopyRegion.bufferImageHeight = 0;

    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(TexDesc.Format);
    // The aspectMask member of imageSubresource must only have a single bit set (18.4)
    if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH)
        CopyRegion.imageSubresource.aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT;
    else if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
    {
        UNSUPPORTED("Updating depth-stencil texture is not currently supported");
        // When copying to or from a depth or stencil aspect, the data in buffer memory uses a layout
        // that is a (mostly) tightly packed representation of the depth or stencil data.
        // To copy both the depth and stencil aspects of a depth/stencil format, two entries in
        // pRegions can be used, where one specifies the depth aspect in imageSubresource, and the
        // other specifies the stencil aspect.
    }
    else
        CopyRegion.imageSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;

    CopyRegion.imageSubresource.baseArrayLayer = ArraySlice;
    CopyRegion.imageSubresource.layerCount     = 1;
    CopyRegion.imageSubresource.mipLevel       = MipLevel;
    // - imageOffset.x and (imageExtent.width + imageOffset.x) must both be greater than or equal to 0 and
    //   less than or equal to the image subresource width (18.4)
    // - imageOffset.y and (imageExtent.height + imageOffset.y) must both be greater than or equal to 0 and
    //   less than or equal to the image subresource height (18.4)
    CopyRegion.imageOffset =
        VkOffset3D //
        {
            static_cast<int32_t>(Region.MinX),
            static_cast<int32_t>(Region.MinY),
            static_cast<int32_t>(Region.MinZ) //
        };
    VERIFY(Region.IsValid(),
           "[", Region.MinX, " .. ", Region.MaxX, ") x [", Region.MinY, " .. ", Region.MaxY, ") x [", Region.MinZ, " .. ", Region.MaxZ, ") is not a valid region");
    CopyRegion.imageExtent =
        VkExtent3D //
        {
            static_cast<uint32_t>(Region.Width()),
            static_cast<uint32_t>(Region.Height()),
            static_cast<uint32_t>(Region.Depth()) //
        };

    return CopyRegion;
}